

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

int32_t pool_sync2(ProcPool *pool)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  ulong in_RAX;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  int32_t i;
  long lVar7;
  Process *proc;
  ulong uStack_38;
  int exit_status;
  
  lVar5 = 0;
  uStack_38 = in_RAX;
  bVar6 = false;
  do {
    while( true ) {
      iVar3 = pool->max_num_procs;
      if (0xf < iVar3) {
        iVar3 = 0x10;
      }
      if (lVar5 < iVar3) break;
      usleep(10000);
      lVar5 = 0;
      bVar1 = !bVar6;
      bVar6 = true;
      if (bVar1) {
        lVar5 = 0x80000000;
LAB_001029b9:
        return (int32_t)lVar5;
      }
    }
    if (pool->procs[lVar5].valid == true) {
      proc = pool->procs + lVar5;
      if (pool->aborted == true) {
        kill(proc->pid,0xf);
      }
      uStack_38 = uStack_38 & 0xffffffff;
      _Var2 = proc_terminated(proc->pid,&exit_status);
      if (_Var2) {
        iVar3 = exit_status;
        pcVar4 = "failed";
        if (exit_status == 0) {
          pcVar4 = "exited correctly";
        }
        printf("Process %d %s [status=%d]: ",(ulong)(uint)proc->pid,pcVar4,(ulong)(uint)exit_status)
        ;
        printf("(CMD");
        for (lVar7 = 0; (lVar7 != 0xff && (proc->args[lVar7] != (char *)0x0)); lVar7 = lVar7 + 1) {
          printf(" %s");
        }
        puts(")");
        if (pool->on_async_proc_exit != (_func_void_Process_ptr_int_void_ptr *)0x0) {
          (*pool->on_async_proc_exit)(proc,iVar3,proc->user_handle);
        }
        proc_destroy(proc);
        goto LAB_001029b9;
      }
      bVar6 = true;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static int32_t pool_sync2(ProcPool *pool) {
    bool any_valid = false;
    do {
        for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
             idx++) {
            Process *p = &pool->procs[idx];
            if (!p->valid) {
                continue;
            } else {
                any_valid = true;
            }

            if (pool->aborted) {
                assert(p->valid);

                // Kill it hard, we don't want CPTP to generate a suboptimal
                // solution in its JSON output
                kill(p->pid, SIGTERM);
            }

            int exit_status = 0;
            if (proc_terminated(p->pid, &exit_status)) {
                printf("Process %d %s [status=%d]: ", p->pid,
                       exit_status == 0 ? "exited correctly" : "failed",
                       exit_status);
                printf("(CMD");

                for (int32_t i = 0; i < PROC_MAX_ARGS - 1 && p->args[i] != NULL;
                     i++) {
                    printf(" %s", p->args[i]);
                }
                printf(")\n");
                if (pool->on_async_proc_exit) {
                    pool->on_async_proc_exit(p, exit_status, p->user_handle);
                }
                proc_destroy(p);
                return idx;
            }
        }
        usleep(PROC_POOL_UPDATE_PERIOD_MSEC * 1000);
    } while (any_valid);

    return INT32_MIN;
}